

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForBuildTree
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_9a;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  string installPrefix;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *dir;
  
  pcVar1 = this->Makefile;
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_41);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar2) {
    bVar2 = MacOSXUseInstallNameDir(this);
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"CMAKE_INSTALL_PREFIX",&local_99);
      psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_98);
      std::__cxx11::string::string((string *)local_78,(string *)psVar3);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      GetInstallNameDirForInstallTree(__return_storage_ptr__,this,local_20,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      return __return_storage_ptr__;
    }
    bVar2 = CanGenerateInstallNameDir(this,INSTALL_NAME_FOR_BUILD);
    if (bVar2) {
      local_9a = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      bVar2 = MacOSXRpathInstallNameDirDefault(this);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"@rpath");
      }
      else {
        GetDirectory(&local_c0,this,local_20,RuntimeBinaryArtifact);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_c1);
  std::allocator<char>::~allocator(&local_c1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetInstallNameDirForBuildTree(
  const std::string& config) const
{
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {

    // If building directly for installation then the build tree install_name
    // is the same as the install tree.
    if (this->MacOSXUseInstallNameDir()) {
      std::string installPrefix =
        this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
      return this->GetInstallNameDirForInstallTree(config, installPrefix);
    }

    // Use the build tree directory for the target.
    if (this->CanGenerateInstallNameDir(INSTALL_NAME_FOR_BUILD)) {
      std::string dir;
      if (this->MacOSXRpathInstallNameDirDefault()) {
        dir = "@rpath";
      } else {
        dir = this->GetDirectory(config);
      }
      dir += "/";
      return dir;
    }
  }
  return "";
}